

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAnimationTracks(OgreXmlSerializer *this,Animation *dest)

{
  bool bVar1;
  string *__lhs;
  DeadlyImportError *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_01;
  basic_formatter *this_02;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_d8;
  string local_a8;
  undefined1 local_88 [8];
  VertexAnimationTrack track;
  Animation *dest_local;
  OgreXmlSerializer *this_local;
  
  track.transformKeyFrames.
  super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)dest;
  NextNode_abi_cxx11_(this);
  while( true ) {
    bVar1 = std::operator==(&this->m_currentNodeName,nnTrack);
    if (!bVar1) {
      return;
    }
    VertexAnimationTrack::VertexAnimationTrack((VertexAnimationTrack *)local_88);
    local_88._0_4_ = VAT_TRANSFORM;
    ReadAttribute<std::__cxx11::string>(&local_a8,this,"bone");
    std::__cxx11::string::operator=((string *)&track,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    __lhs = NextNode_abi_cxx11_(this);
    bVar1 = std::operator!=(__lhs,nnKeyFrames);
    if (bVar1) break;
    ReadAnimationKeyFrames
              (this,(Animation *)
                    track.transformKeyFrames.
                    super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (VertexAnimationTrack *)local_88);
    std::
    vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
    ::push_back((vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
                 *)(track.transformKeyFrames.
                    super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),(value_type *)local_88);
    VertexAnimationTrack::~VertexAnimationTrack((VertexAnimationTrack *)local_88);
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            (&local_250);
  this_01 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_250,(char (*) [33])"No <keyframes> found in <track> ");
  this_02 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                      (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &((track.transformKeyFrames.
                                  super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->rotation).z);
  Formatter::basic_formatter::operator_cast_to_string(&local_d8,this_02);
  DeadlyImportError::DeadlyImportError(this_00,&local_d8);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void OgreXmlSerializer::ReadAnimationTracks(Animation *dest)
{
    NextNode();
    while(m_currentNodeName == nnTrack)
    {
        VertexAnimationTrack track;
        track.type = VertexAnimationTrack::VAT_TRANSFORM;
        track.boneName = ReadAttribute<std::string>("bone");

        if (NextNode() != nnKeyFrames) {
            throw DeadlyImportError(Formatter::format() << "No <keyframes> found in <track> " << dest->name);
        }

        ReadAnimationKeyFrames(dest, &track);

        dest->tracks.push_back(track);
    }
}